

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Compiler(Compiler *this,AnnotationFlag annotationFlag)

{
  Disposer *local_28;
  Impl *pIStack_20;
  AnnotationFlag local_14;
  
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_006276f0;
  local_14 = annotationFlag;
  kj::heap<capnp::compiler::Compiler::Impl,capnp::compiler::Compiler::AnnotationFlag&>
            ((kj *)&local_28,&local_14);
  kj::_::Mutex::Mutex(&(this->impl).mutex);
  (this->impl).value.disposer = local_28;
  (this->impl).value.ptr = pIStack_20;
  SchemaLoader::SchemaLoader(&this->loader,&this->super_LazyLoadCallback);
  return;
}

Assistant:

Compiler::Compiler(AnnotationFlag annotationFlag)
    : impl(kj::heap<Impl>(annotationFlag)),
      loader(*this) {}